

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O3

void PrintMapInfo(WebPPicture *pic)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *__format;
  ulong uVar9;
  long lVar10;
  long local_60;
  
  if ((pic->extra_info != (uint8_t *)0x0) && (uVar2 = pic->height, 0 < (int)uVar2)) {
    iVar3 = pic->width;
    iVar5 = iVar3 + 0x1e;
    if (-1 < iVar3 + 0xf) {
      iVar5 = iVar3 + 0xf;
    }
    uVar4 = pic->extra_info_type;
    uVar7 = iVar5 >> 4;
    uVar6 = 1;
    if (1 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    local_60 = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar6;
      lVar10 = local_60;
      if (0 < iVar3) {
        do {
          if (uVar4 == 1) {
            cVar1 = "+."[pic->extra_info[lVar10]];
LAB_00107cb6:
            fputc((int)cVar1,_stderr);
          }
          else {
            if (uVar4 == 2) {
              cVar1 = ".-*X"[pic->extra_info[lVar10]];
              goto LAB_00107cb6;
            }
            if (uVar4 == 3) {
              __format = "%.2d ";
            }
            else if ((uVar4 & 0xfffffffe) == 6) {
              __format = "%3d ";
            }
            else {
              __format = "0x%.2x ";
            }
            fprintf(_stderr,__format);
          }
          uVar9 = uVar9 - 1;
          lVar10 = lVar10 + 1;
        } while (uVar9 != 0);
      }
      fputc(10,_stderr);
      uVar8 = uVar8 + 1;
      local_60 = local_60 + (ulong)uVar7;
    } while (uVar8 != (ulong)uVar2 + 0xf >> 4);
  }
  return;
}

Assistant:

static void PrintMapInfo(const WebPPicture* const pic) {
  if (pic->extra_info != NULL) {
    const int mb_w = (pic->width + 15) / 16;
    const int mb_h = (pic->height + 15) / 16;
    const int type = pic->extra_info_type;
    int x, y;
    for (y = 0; y < mb_h; ++y) {
      for (x = 0; x < mb_w; ++x) {
        const int c = pic->extra_info[x + y * mb_w];
        if (type == 1) {   // intra4/intra16
          fprintf(stderr, "%c", "+."[c]);
        } else if (type == 2) {    // segments
          fprintf(stderr, "%c", ".-*X"[c]);
        } else if (type == 3) {    // quantizers
          fprintf(stderr, "%.2d ", c);
        } else if (type == 6 || type == 7) {
          fprintf(stderr, "%3d ", c);
        } else {
          fprintf(stderr, "0x%.2x ", c);
        }
      }
      fprintf(stderr, "\n");
    }
  }
}